

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cc
# Opt level: O1

void __thiscall prometheus::detail::Endpoint::~Endpoint(Endpoint *this)

{
  BasicAuthHandler *pBVar1;
  MetricsHandler *pMVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar3;
  
  CivetServer::removeHandler(this->server_,&this->uri_);
  if ((this->auth_handler_)._M_t.
      super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
      ._M_t.
      super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
      .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl !=
      (BasicAuthHandler *)0x0) {
    CivetServer::removeAuthHandler(this->server_,&this->uri_);
  }
  pBVar1 = (this->auth_handler_)._M_t.
           super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
           ._M_t.
           super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
           .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl;
  if (pBVar1 != (BasicAuthHandler *)0x0) {
    (*(pBVar1->super_CivetAuthHandler)._vptr_CivetAuthHandler[1])();
  }
  (this->auth_handler_)._M_t.
  super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  ._M_t.
  super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
  .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl =
       (BasicAuthHandler *)0x0;
  pMVar2 = (this->metrics_handler_)._M_t.
           super___uniq_ptr_impl<prometheus::detail::MetricsHandler,_std::default_delete<prometheus::detail::MetricsHandler>_>
           ._M_t.
           super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
           .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>._M_head_impl;
  if (pMVar2 != (MetricsHandler *)0x0) {
    (*(pMVar2->super_CivetHandler)._vptr_CivetHandler[1])();
  }
  (this->metrics_handler_)._M_t.
  super___uniq_ptr_impl<prometheus::detail::MetricsHandler,_std::default_delete<prometheus::detail::MetricsHandler>_>
  ._M_t.
  super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
  .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>._M_head_impl =
       (MetricsHandler *)0x0;
  this_00 = (this->endpoint_registry_).
            super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar3 = (this->uri_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->uri_).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

Endpoint::~Endpoint() {
  server_.removeHandler(uri_);
  if (auth_handler_) {
    server_.removeAuthHandler(uri_);
  }
}